

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParameterizedTestSuite<RegisterExceptionTypeParamTest,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop>,_iutest::detail::VariadicTypeList<exception_value>_>
::
EachTest<exception_value,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop>_>
::EachTest(EachTest<exception_value,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop>_>
           *this,TestSuite *testsuite,string *name)

{
  UnitTest *this_00;
  
  (this->super_iuIObject)._vptr_iuIObject = (_func_int **)&PTR__EachTest_00132b68;
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = testsuite;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_00132bb0;
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_00132c08;
  TestInfo::TestInfo(&this->m_info,&(this->m_mediator).super_iuITestSuiteMediator,name,
                     &(this->m_factory).super_iuFactoryBase);
  this_00 = UnitTest::instance();
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,testsuite,&this->m_info);
  return;
}

Assistant:

EachTest(TestSuite* testsuite, const ::std::string& name)
            : m_mediator(testsuite)
            , m_info(&m_mediator, name, &m_factory)
        {
            UnitTest::instance().AddTestInfo(testsuite, &m_info);
        }